

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params cctxParams_00;
  ZSTD_parameters params_00;
  ZSTD_CCtx_params params_01;
  uint uVar1;
  size_t code;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  void *unaff_retaddr;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  void *in_stack_00000018;
  ZSTD_strategy in_stack_00000020;
  int in_stack_00000024;
  undefined4 uStack0000000000000028;
  undefined4 uStack000000000000002c;
  ZSTD_CCtx_params cctxParams;
  size_t errcod;
  undefined8 in_stack_ffffffffffffff48;
  unsigned_long_long in_stack_ffffffffffffff58;
  ZSTD_CDict *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  ZSTD_CStream *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_fffffffffffffff8;
  
  cParams._8_8_ = in_stack_00000010;
  cParams._0_8_ = in_stack_00000008;
  cParams._16_8_ = in_stack_00000018;
  cParams.strategy = in_stack_00000020;
  code = ZSTD_checkCParams(cParams);
  uVar1 = ERR_isError(code);
  if (uVar1 == 0) {
    if ((in_RCX == 0) && (in_stack_00000024 == 0)) {
      in_RCX = -1;
    }
    params_00.cParams.chainLog = in_stack_00000024;
    params_00.cParams.windowLog = in_stack_00000020;
    params_00.cParams.hashLog = uStack0000000000000028;
    params_00.cParams.searchLog = uStack000000000000002c;
    cctxParams_00.customMem.customAlloc = (ZSTD_allocFunction)in_stack_00000008;
    cctxParams_00._0_96_ = *(undefined1 (*) [96])(in_RDI + 0x28);
    cctxParams_00.customMem.customFree = (ZSTD_freeFunction)in_stack_00000010;
    cctxParams_00.customMem.opaque = in_stack_00000018;
    params_00.cParams._16_8_ = in_RDI + 0x10;
    params_00._24_8_ = &stack0xfffffffffffffe98;
    params_00.fParams.checksumFlag = (int)in_stack_ffffffffffffff48;
    params_00.fParams.noDictIDFlag = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    ZSTD_assignParamsToCCtxParams(cctxParams_00,params_00);
    params_01.cParams.chainLog = (int)in_stack_ffffffffffffff98;
    params_01.cParams.hashLog = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    params_01.format = (int)in_stack_ffffffffffffff90;
    params_01.cParams.windowLog = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    params_01.cParams.searchLog = (int)in_stack_ffffffffffffffa0;
    params_01.cParams.searchLength = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    params_01.cParams.targetLength = (int)in_stack_ffffffffffffffa8;
    params_01.cParams.strategy = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    params_01.fParams.contentSizeFlag = (int)in_stack_ffffffffffffffb0;
    params_01.fParams.checksumFlag = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    params_01.fParams.noDictIDFlag = (int)in_stack_ffffffffffffffb8;
    params_01.compressionLevel = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    params_01.disableLiteralCompression = (int)in_stack_ffffffffffffffc0;
    params_01.forceWindow = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
    params_01.nbWorkers = (int)in_stack_ffffffffffffffc8;
    params_01.jobSize = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    params_01.overlapSizeLog = (int)code;
    params_01.ldmParams.enableLdm = (int)(code >> 0x20);
    params_01.ldmParams.hashLog = (int)in_RCX;
    params_01.ldmParams.bucketSizeLog = (int)((ulong)in_RCX >> 0x20);
    params_01.ldmParams.minMatchLength = (int)in_RDX;
    params_01.ldmParams.hashEveryLog = (int)((ulong)in_RDX >> 0x20);
    params_01._88_8_ = in_RSI;
    params_01.customMem.customAlloc = (ZSTD_allocFunction)in_RDI;
    params_01.customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffff8;
    params_01.customMem.opaque = unaff_retaddr;
    code = ZSTD_initCStream_internal
                     (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      in_stack_ffffffffffffff60,params_01,in_stack_ffffffffffffff58);
  }
  return code;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_advanced: pledgedSrcSize=%u, flag=%u",
                (U32)pledgedSrcSize, params.fParams.contentSizeFlag);
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    if ((pledgedSrcSize==0) && (params.fParams.contentSizeFlag==0)) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;  /* for compatibility with older programs relying on this behavior. Users should now specify ZSTD_CONTENTSIZE_UNKNOWN. This line will be removed in the future. */
    {   ZSTD_CCtx_params const cctxParams = ZSTD_assignParamsToCCtxParams(zcs->requestedParams, params);
        return ZSTD_initCStream_internal(zcs, dict, dictSize, NULL /*cdict*/, cctxParams, pledgedSrcSize);
    }
}